

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O2

RGBA deqp::toRGBA(Vec4 *a)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  uint uVar11;
  uint uVar12;
  
  fVar6 = a->m_data[0] * 255.0;
  fVar8 = a->m_data[1] * 255.0;
  fVar9 = a->m_data[2] * 255.0;
  fVar10 = a->m_data[3] * 255.0;
  uVar2 = -(uint)(fVar6 < 0.0);
  uVar3 = -(uint)(fVar8 < 0.0);
  uVar4 = -(uint)(fVar9 < 0.0);
  uVar5 = -(uint)(fVar10 < 0.0);
  uVar7 = (uint)((float)(uVar2 & 0xbf000000 | ~uVar2 & 0x3f000000) + fVar6);
  uVar3 = (uint)((float)(uVar3 & 0xbf000000 | ~uVar3 & 0x3f000000) + fVar8);
  uVar4 = (uint)((float)(uVar4 & 0xbf000000 | ~uVar4 & 0x3f000000) + fVar9);
  uVar5 = (uint)((float)(uVar5 & 0xbf000000 | ~uVar5 & 0x3f000000) + fVar10);
  uVar2 = uVar7;
  if (0xfe < uVar7) {
    uVar2 = 0xff;
  }
  uVar1 = 0xff;
  if (uVar3 < 0xff) {
    uVar1 = uVar3;
  }
  uVar11 = -(uint)(-0x7fffff02 < (int)(uVar4 ^ 0x80000000));
  uVar12 = -(uint)(-0x7fffff02 < (int)(uVar5 ^ 0x80000000));
  return (RGBA)(~((int)uVar5 >> 0x1f) & (uVar12 >> 0x18 | ~uVar12 & uVar5) << 0x18 |
                ~((int)uVar3 >> 0x1f) & uVar1 << 8 |
               ~((int)uVar4 >> 0x1f) & (uVar11 >> 0x18 | ~uVar11 & uVar4) << 0x10 |
               ~((int)uVar7 >> 0x1f) & uVar2);
}

Assistant:

T						x			(void) const { return m_data[0]; }